

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressBlock_btlazy2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *pBVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined8 uVar4;
  seqStore_t *psVar5;
  uint uVar6;
  size_t sVar7;
  ulong *puVar8;
  seqDef *psVar9;
  uint uVar10;
  uint uVar11;
  ulong *puVar12;
  long lVar13;
  U32 UVar14;
  ulong uVar15;
  ulong *puVar16;
  ulong *puVar17;
  ulong *puVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  size_t sVar22;
  ulong *puVar23;
  BYTE *pBVar24;
  BYTE *litEnd;
  ulong uVar25;
  size_t offsetFound;
  BYTE *pInLoopLimit;
  BYTE *litLimit_w;
  uint local_bc;
  size_t local_b8;
  ulong *local_b0;
  uint local_a4;
  size_t local_a0;
  ulong *local_98;
  ulong *local_90;
  ulong *local_88;
  ulong *local_80;
  ulong *local_78;
  long local_70;
  ZSTD_matchState_t *local_68;
  uint local_5c;
  uint local_58;
  uint local_54;
  seqStore_t *local_50;
  BYTE *local_48;
  ulong *local_40;
  uint *local_38;
  
  puVar16 = (ulong *)((long)src + srcSize);
  local_48 = (ms->window).base + (ms->window).dictLimit;
  local_54 = rep[1];
  puVar23 = (ulong *)((ulong)((int)src == (int)local_48) + (long)src);
  local_58 = (int)puVar23 - (int)local_48;
  uVar25 = (ulong)local_54;
  if (local_58 < local_54) {
    uVar25 = 0;
  }
  uVar10 = (uint)uVar25;
  local_90 = (ulong *)((long)src + (srcSize - 8));
  local_5c = *rep;
  uVar21 = (ulong)local_5c;
  if (local_58 < local_5c) {
    uVar21 = 0;
  }
  uVar6 = (uint)uVar21;
  if (puVar23 < local_90) {
    puVar18 = (ulong *)((long)puVar16 + -7);
    local_78 = (ulong *)((long)puVar16 + -3);
    local_80 = (ulong *)((long)puVar16 + -1);
    local_40 = puVar16 + -4;
    local_b0 = puVar16;
    local_98 = puVar18;
    local_68 = ms;
    local_50 = seqStore;
    local_38 = rep;
    do {
      local_bc = (uint)uVar21;
      local_70 = -uVar21;
      if (local_bc == 0) {
        uVar15 = 0;
      }
      else {
        uVar15 = 0;
        if (*(int *)(((long)puVar23 + 1) - uVar21) == *(int *)((long)puVar23 + 1)) {
          puVar8 = (ulong *)((long)puVar23 + 5);
          puVar12 = (ulong *)((long)puVar23 + local_70 + 5);
          puVar17 = puVar8;
          if (puVar8 < puVar18) {
            if (*puVar12 == *puVar8) {
              lVar13 = 0;
              do {
                puVar17 = (ulong *)((long)puVar23 + lVar13 + 0xd);
                if (puVar18 <= puVar17) {
                  puVar12 = (ulong *)((long)puVar23 + local_70 + lVar13 + 0xd);
                  puVar17 = (ulong *)((long)puVar23 + lVar13 + 0xd);
                  goto LAB_0011fec1;
                }
                uVar15 = *(ulong *)((long)puVar23 + lVar13 + local_70 + 0xd);
                uVar20 = *puVar17;
                lVar13 = lVar13 + 8;
              } while (uVar15 == uVar20);
              uVar20 = uVar20 ^ uVar15;
              uVar15 = 0;
              if (uVar20 != 0) {
                for (; (uVar20 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                }
              }
              uVar15 = (uVar15 >> 3 & 0x1fffffff) + lVar13;
            }
            else {
              uVar20 = *puVar8 ^ *puVar12;
              uVar15 = 0;
              if (uVar20 != 0) {
                for (; (uVar20 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                }
              }
              uVar15 = uVar15 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_0011fec1:
            if ((puVar17 < local_78) && ((int)*puVar12 == (int)*puVar17)) {
              puVar17 = (ulong *)((long)puVar17 + 4);
              puVar12 = (ulong *)((long)puVar12 + 4);
            }
            if ((puVar17 < local_80) && ((short)*puVar12 == (short)*puVar17)) {
              puVar17 = (ulong *)((long)puVar17 + 2);
              puVar12 = (ulong *)((long)puVar12 + 2);
            }
            if (puVar17 < puVar16) {
              puVar17 = (ulong *)((long)puVar17 + (ulong)((BYTE)*puVar12 == (BYTE)*puVar17));
            }
            uVar15 = (long)puVar17 - (long)puVar8;
          }
          uVar15 = uVar15 + 4;
        }
      }
      local_b8 = 999999999;
      sVar7 = ZSTD_BtFindBestMatch_selectMLS(local_68,(BYTE *)puVar23,(BYTE *)puVar16,&local_b8);
      uVar20 = uVar15;
      if (uVar15 < sVar7) {
        uVar20 = sVar7;
      }
      if (uVar20 < 4) {
        puVar23 = (ulong *)((long)puVar23 + ((long)puVar23 - (long)src >> 8) + 1);
        puVar18 = local_98;
      }
      else {
        local_a4 = (uint)uVar25;
        local_88 = puVar23;
        sVar22 = local_b8;
        if (sVar7 <= uVar15) {
          local_88 = (ulong *)((long)puVar23 + 1);
          sVar22 = 0;
        }
        if (puVar23 < local_90) {
          do {
            puVar16 = (ulong *)((long)puVar23 + 1);
            if (sVar22 == 0) {
              local_a0 = 0;
            }
            else {
              local_a0 = sVar22;
              if ((local_bc != 0) && (*(int *)puVar16 == *(int *)((long)puVar16 + local_70))) {
                puVar18 = (ulong *)((long)puVar23 + 5);
                puVar17 = (ulong *)((long)puVar23 + local_70 + 5);
                puVar8 = puVar18;
                if (puVar18 < local_98) {
                  if (*puVar17 == *puVar18) {
                    lVar13 = 0;
                    do {
                      puVar8 = (ulong *)((long)puVar23 + lVar13 + 0xd);
                      if (local_98 <= puVar8) {
                        puVar17 = (ulong *)((long)puVar23 + local_70 + lVar13 + 0xd);
                        puVar8 = (ulong *)((long)puVar23 + lVar13 + 0xd);
                        goto LAB_0012005e;
                      }
                      uVar25 = *(ulong *)((long)puVar23 + lVar13 + local_70 + 0xd);
                      uVar21 = *puVar8;
                      lVar13 = lVar13 + 8;
                    } while (uVar25 == uVar21);
                    uVar21 = uVar21 ^ uVar25;
                    uVar25 = 0;
                    if (uVar21 != 0) {
                      for (; (uVar21 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                      }
                    }
                    uVar25 = (uVar25 >> 3 & 0x1fffffff) + lVar13;
                  }
                  else {
                    uVar21 = *puVar18 ^ *puVar17;
                    uVar25 = 0;
                    if (uVar21 != 0) {
                      for (; (uVar21 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                      }
                    }
                    uVar25 = uVar25 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_0012005e:
                  if ((puVar8 < local_78) && ((int)*puVar17 == (int)*puVar8)) {
                    puVar8 = (ulong *)((long)puVar8 + 4);
                    puVar17 = (ulong *)((long)puVar17 + 4);
                  }
                  if ((puVar8 < local_80) && ((short)*puVar17 == (short)*puVar8)) {
                    puVar8 = (ulong *)((long)puVar8 + 2);
                    puVar17 = (ulong *)((long)puVar17 + 2);
                  }
                  if (puVar8 < local_b0) {
                    puVar8 = (ulong *)((long)puVar8 + (ulong)((BYTE)*puVar17 == (BYTE)*puVar8));
                  }
                  uVar25 = (long)puVar8 - (long)puVar18;
                }
                uVar10 = (int)sVar22 + 1;
                if (uVar10 == 0) goto LAB_0012076a;
                if (uVar25 < 0xfffffffffffffffc) {
                  uVar6 = 0x1f;
                  if (uVar10 != 0) {
                    for (; uVar10 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                    }
                  }
                  if ((int)((uVar6 ^ 0x1f) + (int)uVar20 * 3 + -0x1e) < (int)(uVar25 + 4) * 3) {
                    local_a0 = 0;
                    uVar20 = uVar25 + 4;
                    local_88 = puVar16;
                  }
                }
              }
            }
            local_b8 = 999999999;
            sVar7 = ZSTD_BtFindBestMatch_selectMLS
                              (local_68,(BYTE *)puVar16,(BYTE *)local_b0,&local_b8);
            uVar10 = (int)local_b8 + 1;
            if ((uVar10 == 0) || (uVar6 = (int)local_a0 + 1, uVar6 == 0)) goto LAB_0012076a;
            if (sVar7 < 4) {
LAB_0012014e:
              sVar22 = local_a0;
              if (local_90 <= puVar16) break;
              puVar16 = (ulong *)((long)puVar23 + 2);
              if (local_a0 == 0) {
                sVar22 = 0;
              }
              else if ((local_bc != 0) && (*(int *)puVar16 == *(int *)((long)puVar16 + local_70))) {
                puVar8 = (ulong *)((long)puVar23 + 6);
                puVar18 = (ulong *)((long)puVar23 + local_70 + 6);
                puVar17 = puVar8;
                if (puVar8 < local_98) {
                  if (*puVar18 == *puVar8) {
                    puVar17 = (ulong *)((long)puVar23 + 0xe);
                    do {
                      if (local_98 <= puVar17) {
                        puVar18 = (ulong *)((long)puVar17 + local_70);
                        goto LAB_001201f4;
                      }
                      puVar23 = (ulong *)((long)puVar17 + local_70);
                      uVar25 = *puVar17;
                      puVar17 = puVar17 + 1;
                    } while (*puVar23 == uVar25);
                    uVar25 = uVar25 ^ *puVar23;
                    uVar21 = 0;
                    if (uVar25 != 0) {
                      for (; (uVar25 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                      }
                    }
                    puVar17 = (ulong *)((long)puVar17 + ((uVar21 >> 3 & 0x1fffffff) - 8));
                    goto LAB_00120239;
                  }
                  uVar21 = *puVar8 ^ *puVar18;
                  uVar25 = 0;
                  if (uVar21 != 0) {
                    for (; (uVar21 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                    }
                  }
                  uVar25 = uVar25 >> 3 & 0x1fffffff;
                }
                else {
LAB_001201f4:
                  if ((puVar17 < local_78) && ((int)*puVar18 == (int)*puVar17)) {
                    puVar17 = (ulong *)((long)puVar17 + 4);
                    puVar18 = (ulong *)((long)puVar18 + 4);
                  }
                  if ((puVar17 < local_80) && ((short)*puVar18 == (short)*puVar17)) {
                    puVar17 = (ulong *)((long)puVar17 + 2);
                    puVar18 = (ulong *)((long)puVar18 + 2);
                  }
                  if (puVar17 < local_b0) {
                    puVar17 = (ulong *)((long)puVar17 + (ulong)((BYTE)*puVar18 == (BYTE)*puVar17));
                  }
LAB_00120239:
                  uVar25 = (long)puVar17 - (long)puVar8;
                  if (0xfffffffffffffffb < uVar25) goto LAB_0012026a;
                }
                uVar10 = 0x1f;
                if (uVar6 != 0) {
                  for (; uVar6 >> uVar10 == 0; uVar10 = uVar10 - 1) {
                  }
                }
                if ((int)((uVar10 ^ 0x1f) + (int)uVar20 * 4 + -0x1e) < (int)(uVar25 + 4) * 4) {
                  sVar22 = 0;
                  uVar20 = uVar25 + 4;
                  local_88 = puVar16;
                }
              }
LAB_0012026a:
              local_b8 = 999999999;
              sVar7 = ZSTD_BtFindBestMatch_selectMLS
                                (local_68,(BYTE *)puVar16,(BYTE *)local_b0,&local_b8);
              uVar10 = (int)local_b8 + 1;
              if ((uVar10 == 0) || (uVar6 = (int)sVar22 + 1, uVar6 == 0)) {
LAB_0012076a:
                __assert_fail("val != 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x12c2,"U32 ZSTD_highbit32(U32)");
              }
              if (sVar7 < 4) break;
              iVar3 = 0x1f;
              if (uVar10 != 0) {
                for (; uVar10 >> iVar3 == 0; iVar3 = iVar3 + -1) {
                }
              }
              uVar10 = 0x1f;
              if (uVar6 != 0) {
                for (; uVar6 >> uVar10 == 0; uVar10 = uVar10 - 1) {
                }
              }
              if ((int)sVar7 * 4 - iVar3 <= (int)((uVar10 ^ 0x1f) + (int)uVar20 * 4 + -0x18)) break;
            }
            else {
              iVar3 = 0x1f;
              if (uVar10 != 0) {
                for (; uVar10 >> iVar3 == 0; iVar3 = iVar3 + -1) {
                }
              }
              uVar10 = 0x1f;
              if (uVar6 != 0) {
                for (; uVar6 >> uVar10 == 0; uVar10 = uVar10 - 1) {
                }
              }
              if ((int)sVar7 * 4 - iVar3 <= (int)((uVar10 ^ 0x1f) + (int)uVar20 * 4 + -0x1b))
              goto LAB_0012014e;
            }
            puVar23 = puVar16;
            sVar22 = local_b8;
            uVar20 = sVar7;
            local_88 = puVar23;
          } while (puVar23 < local_90);
        }
        psVar5 = local_50;
        puVar23 = local_88;
        if (sVar22 == 0) {
          UVar14 = 1;
          uVar10 = local_a4;
        }
        else {
          if ((src < local_88) && (local_48 < (BYTE *)((long)local_88 + (2 - sVar22)))) {
            puVar16 = local_88;
            while (puVar23 = puVar16,
                  *(BYTE *)((long)puVar16 - 1) == *(BYTE *)((long)puVar16 + (1 - sVar22))) {
              puVar23 = (ulong *)((long)puVar16 - 1);
              uVar20 = uVar20 + 1;
              if ((puVar23 <= src) ||
                 (pBVar24 = (BYTE *)((long)puVar16 + (1 - sVar22)), puVar16 = puVar23,
                 pBVar24 <= local_48)) break;
            }
          }
          UVar14 = (int)sVar22 + 1;
          uVar10 = local_bc;
          local_bc = (int)sVar22 - 2;
        }
        if (local_50->maxNbSeq <=
            (ulong)((long)local_50->sequences - (long)local_50->sequencesStart >> 3)) {
LAB_001207c7:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2038,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        local_a4 = uVar10;
        if (0x20000 < local_50->maxNbLit) {
LAB_001207e6:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203a,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar25 = (long)puVar23 - (long)src;
        puVar16 = (ulong *)local_50->lit;
        if (local_50->litStart + local_50->maxNbLit < (BYTE *)((long)puVar16 + uVar25)) {
LAB_001207a8:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_b0 < puVar23) {
LAB_00120789:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x203c,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_40 < puVar23) {
          ZSTD_safecopyLiterals((BYTE *)puVar16,(BYTE *)src,(BYTE *)puVar23,(BYTE *)local_40);
LAB_001203e8:
          psVar5->lit = psVar5->lit + uVar25;
          if (0xffff < uVar25) {
            if (psVar5->longLengthID != 0) {
              __assert_fail("seqStorePtr->longLengthID == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x204d,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            psVar5->longLengthID = 1;
            psVar5->longLengthPos =
                 (U32)((ulong)((long)psVar5->sequences - (long)psVar5->sequencesStart) >> 3);
          }
        }
        else {
          uVar21 = *(ulong *)((long)src + 8);
          *puVar16 = *src;
          puVar16[1] = uVar21;
          pBVar24 = local_50->lit;
          if (0x10 < uVar25) {
            lVar13 = (long)(pBVar24 + 0x10) - ((long)src + 0x10);
            if (lVar13 < 8) {
              if (-0x10 < lVar13) {
                __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1268,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
            }
            else if (0xffffffffffffffe0 < lVar13 - 0x10U) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1270,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar21 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar24 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar24 + 0x18) = uVar21;
            if (0x20 < (long)uVar25) {
              lVar13 = 0;
              do {
                puVar2 = (undefined8 *)((long)src + lVar13 + 0x20);
                uVar4 = puVar2[1];
                pBVar1 = pBVar24 + lVar13 + 0x20;
                *(undefined8 *)pBVar1 = *puVar2;
                *(undefined8 *)(pBVar1 + 8) = uVar4;
                puVar2 = (undefined8 *)((long)src + lVar13 + 0x30);
                uVar4 = puVar2[1];
                *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
                *(undefined8 *)(pBVar1 + 0x18) = uVar4;
                lVar13 = lVar13 + 0x20;
              } while (pBVar1 + 0x20 < pBVar24 + uVar25);
            }
            goto LAB_001203e8;
          }
          local_50->lit = pBVar24 + uVar25;
        }
        puVar16 = local_b0;
        psVar9 = psVar5->sequences;
        psVar9->litLength = (U16)uVar25;
        psVar9->offset = UVar14;
        if (0xffff < uVar20 - 3) {
          if (psVar5->longLengthID != 0) {
LAB_00120805:
            __assert_fail("seqStorePtr->longLengthID == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2058,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          psVar5->longLengthID = 2;
          psVar5->longLengthPos = (U32)((ulong)((long)psVar9 - (long)psVar5->sequencesStart) >> 3);
        }
        psVar9->matchLength = (U16)(uVar20 - 3);
        psVar9 = psVar9 + 1;
        psVar5->sequences = psVar9;
        puVar23 = (ulong *)((long)puVar23 + uVar20);
        puVar18 = local_98;
        if ((local_a4 == 0) || (local_90 < puVar23)) {
          uVar21 = (ulong)local_bc;
          src = puVar23;
          uVar25 = (ulong)local_a4;
        }
        else {
          uVar21 = (ulong)local_bc;
          uVar15 = (ulong)local_a4;
          while (uVar20 = uVar15, uVar15 = uVar21, uVar21 = uVar15, src = puVar23, uVar25 = uVar20,
                (int)*puVar23 == *(int *)((long)puVar23 - uVar20)) {
            lVar13 = -uVar20;
            puVar8 = (ulong *)((long)puVar23 + 4);
            puVar12 = (ulong *)((long)puVar23 + lVar13 + 4);
            puVar17 = puVar8;
            if (puVar8 < puVar18) {
              if (*puVar12 == *puVar8) {
                lVar19 = 0;
                do {
                  puVar17 = (ulong *)((long)puVar23 + lVar19 + 0xc);
                  if (puVar18 <= puVar17) {
                    puVar12 = (ulong *)((long)puVar23 + lVar13 + lVar19 + 0xc);
                    puVar17 = (ulong *)((long)puVar23 + lVar19 + 0xc);
                    goto LAB_00120570;
                  }
                  uVar25 = *(ulong *)((long)puVar23 + lVar19 + lVar13 + 0xc);
                  uVar21 = *puVar17;
                  lVar19 = lVar19 + 8;
                } while (uVar25 == uVar21);
                uVar21 = uVar21 ^ uVar25;
                uVar25 = 0;
                if (uVar21 != 0) {
                  for (; (uVar21 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                  }
                }
                uVar25 = (uVar25 >> 3 & 0x1fffffff) + lVar19;
              }
              else {
                uVar21 = *puVar8 ^ *puVar12;
                uVar25 = 0;
                if (uVar21 != 0) {
                  for (; (uVar21 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                  }
                }
                uVar25 = uVar25 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_00120570:
              if ((puVar17 < local_78) && ((int)*puVar12 == (int)*puVar17)) {
                puVar17 = (ulong *)((long)puVar17 + 4);
                puVar12 = (ulong *)((long)puVar12 + 4);
              }
              if ((puVar17 < local_80) && ((short)*puVar12 == (short)*puVar17)) {
                puVar17 = (ulong *)((long)puVar17 + 2);
                puVar12 = (ulong *)((long)puVar12 + 2);
              }
              if (puVar17 < puVar16) {
                puVar17 = (ulong *)((long)puVar17 + (ulong)((BYTE)*puVar12 == (BYTE)*puVar17));
              }
              uVar25 = (long)puVar17 - (long)puVar8;
            }
            if (psVar5->maxNbSeq <= (ulong)((long)psVar9 - (long)psVar5->sequencesStart >> 3))
            goto LAB_001207c7;
            if (0x20000 < psVar5->maxNbLit) goto LAB_001207e6;
            puVar8 = (ulong *)psVar5->lit;
            if (psVar5->litStart + psVar5->maxNbLit < puVar8) goto LAB_001207a8;
            if (puVar16 < puVar23) goto LAB_00120789;
            if (local_40 < puVar23) {
              ZSTD_safecopyLiterals((BYTE *)puVar8,(BYTE *)puVar23,(BYTE *)puVar23,(BYTE *)local_40)
              ;
              puVar18 = local_98;
            }
            else {
              uVar21 = puVar23[1];
              *puVar8 = *puVar23;
              puVar8[1] = uVar21;
            }
            psVar9 = psVar5->sequences;
            psVar9->litLength = 0;
            psVar9->offset = 1;
            if (0xffff < uVar25 + 1) {
              if (psVar5->longLengthID != 0) goto LAB_00120805;
              psVar5->longLengthID = 2;
              psVar5->longLengthPos =
                   (U32)((ulong)((long)psVar9 - (long)psVar5->sequencesStart) >> 3);
            }
            psVar9->matchLength = (U16)(uVar25 + 1);
            psVar9 = psVar9 + 1;
            psVar5->sequences = psVar9;
            puVar23 = (ulong *)((long)puVar23 + uVar25 + 4);
            uVar21 = uVar20;
            src = puVar23;
            uVar25 = uVar15;
            if (((int)uVar15 == 0) || (local_90 < puVar23)) break;
          }
        }
      }
      uVar10 = (uint)uVar25;
      uVar6 = (uint)uVar21;
      rep = local_38;
    } while (puVar23 < local_90);
  }
  uVar11 = 0;
  if (local_58 < local_54) {
    uVar11 = local_54;
  }
  if (local_58 < local_5c) {
    uVar11 = local_5c;
  }
  if (uVar6 == 0) {
    uVar6 = uVar11;
  }
  if (uVar10 != 0) {
    uVar11 = uVar10;
  }
  *rep = uVar6;
  rep[1] = uVar11;
  return (long)puVar16 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_btlazy2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_binaryTree, 2, ZSTD_noDict);
}